

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void * __thiscall AllocatorState::alloc(AllocatorState *this,size_t size)

{
  int iVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *local_50;
  void *pvStack_38;
  int err;
  void *result;
  size_t alignment;
  size_t sStack_20;
  int i;
  size_t size_local;
  AllocatorState *this_local;
  
  sStack_20 = size;
  size_local = (size_t)this;
  iVar1 = TestHarness::Uniform(&this->super_TestHarness,100);
  if ((double)iVar1 < this->memalign_fraction_ * 100.0) {
    for (alignment._4_4_ = 0; alignment._4_4_ < 5; alignment._4_4_ = alignment._4_4_ + 1) {
      iVar1 = TestHarness::Uniform(&this->super_TestHarness,0x12);
      result = (void *)(1L << ((byte)iVar1 & 0x3f));
      if (((void *)0x7 < result) &&
         ((sStack_20 < 8 ||
          (auVar3._8_4_ = (int)((ulong)result >> 0x20), auVar3._0_8_ = result,
          auVar3._12_4_ = 0x45300000, auVar4._8_4_ = (int)(sStack_20 >> 0x20),
          auVar4._0_8_ = sStack_20, auVar4._12_4_ = 0x45300000,
          (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)result) - 4503599627370496.0) <
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sStack_20) - 4503599627370496.0)) * 6.0)))) {
        pvStack_38 = (void *)0x1234;
        iVar1 = PosixMemalign(&stack0xffffffffffffffc8,(size_t)result,sStack_20);
        if ((iVar1 != 0) && (iVar1 != 0xc)) {
          fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                  ,0x184,"err","==","12");
          abort();
        }
        if (iVar1 == 0) {
          local_50 = pvStack_38;
        }
        else {
          local_50 = (void *)0x0;
        }
        return local_50;
      }
    }
  }
  pvVar2 = malloc(sStack_20);
  pvVar2 = noopt<void*>(pvVar2);
  return pvVar2;
}

Assistant:

void* alloc(size_t size) {
    if (Uniform(100) < memalign_fraction_ * 100) {
      // Try a few times to find a reasonable alignment, or fall back on malloc.
      for (int i = 0; i < 5; i++) {
        size_t alignment = size_t{1} << Uniform(FLAGS_lg_max_memalign);
        if (alignment >= sizeof(intptr_t) &&
            (size < sizeof(intptr_t) ||
             alignment < FLAGS_memalign_max_alignment_ratio * size)) {
          void *result = reinterpret_cast<void*>(static_cast<intptr_t>(0x1234));
          int err = PosixMemalign(&result, alignment, size);
          if (err != 0) {
            CHECK_EQ(err, ENOMEM);
          }
          return err == 0 ? result : nullptr;
        }
      }
    }
    return noopt(malloc(size));
  }